

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs_log_store.cxx
# Opt level: O2

ulong __thiscall cornerstone::fs_log_store::next_slot(fs_log_store *this)

{
  ulong uVar1;
  ulong uVar2;
  
  std::recursive_mutex::lock(&this->store_lock_);
  uVar1 = this->entries_in_store_;
  uVar2 = this->start_idx_;
  pthread_mutex_unlock((pthread_mutex_t *)&this->store_lock_);
  return uVar1 + uVar2;
}

Assistant:

ulong fs_log_store::next_slot() const
{
    recur_lock(store_lock_);
    return start_idx_ + entries_in_store_;
}